

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall SSTable::SSTable(SSTable *this,SSTable *rhs)

{
  SSTable *rhs_local;
  SSTable *this_local;
  
  std::filesystem::__cxx11::path::path(&this->file);
  this->header = (SSTableHeader *)0x0;
  this->data = (SSTableData *)0x0;
  this->index = (SSTableIndex *)0x0;
  std::filesystem::__cxx11::path::operator=(&this->file,&rhs->file);
  this->header = rhs->header;
  this->data = rhs->data;
  this->index = rhs->index;
  rhs->header = (SSTableHeader *)0x0;
  rhs->data = (SSTableData *)0x0;
  rhs->index = (SSTableIndex *)0x0;
  return;
}

Assistant:

SSTable::SSTable(SSTable &&rhs) noexcept {
    file = rhs.file;
    header = rhs.header;
    data = rhs.data;
    index = rhs.index;
    rhs.header = nullptr;
    rhs.data = nullptr;
    rhs.index = nullptr;
}